

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O0

void generate<trng::yarn3>(size_t samples,unsigned_long seed)

{
  parameter_type P;
  int iVar1;
  result_type rVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong in_RSI;
  ulong in_RDI;
  size_t j;
  yarn3 r;
  undefined4 in_stack_ffffffffffffff90;
  result_type in_stack_ffffffffffffff94;
  undefined4 local_68;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  ulong local_50;
  
  P.a[1] = in_stack_ffffffffffffffa0;
  P.a[0] = in_stack_ffffffffffffff9c;
  P.a[2] = in_stack_ffffffffffffffa4;
  trng::yarn3::yarn3((yarn3 *)0x10a729,P);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "#==================================================================\n");
  poVar3 = std::operator<<(poVar3,"# generator ");
  local_68 = SUB84(poVar3,0);
  uVar5 = (undefined4)((ulong)poVar3 >> 0x20);
  pcVar4 = trng::yarn3::name();
  poVar3 = std::operator<<((ostream *)CONCAT44(uVar5,local_68),pcVar4);
  poVar3 = std::operator<<(poVar3,"  seed = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RSI);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,
                           "#==================================================================\n");
  poVar3 = std::operator<<(poVar3,"type: d\n");
  poVar3 = std::operator<<(poVar3,"count: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"numbit: ");
  trng::yarn3::max();
  trng::yarn3::min();
  iVar1 = trng::int_math::log2_ceil<int>(0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  std::operator<<(poVar3,'\n');
  for (local_50 = 0; local_50 < in_RDI; local_50 = local_50 + 1) {
    in_stack_ffffffffffffff94 =
         trng::yarn3::operator()
                   ((yarn3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    rVar2 = trng::yarn3::min();
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,in_stack_ffffffffffffff94 - rVar2);
    std::operator<<(poVar3,'\n');
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}